

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fOpaqueTypeIndexingTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockArrayIndexingCase::iterate
          (BlockArrayIndexingCase *this)

{
  undefined4 *puVar1;
  ostringstream *this_00;
  uint uVar2;
  BlockType BVar3;
  undefined4 uVar4;
  RenderContext *renderCtx;
  TestContext *this_01;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  uint uVar10;
  deUint32 dVar11;
  ContextType ctxType;
  IndexExprType IVar12;
  int iVar13;
  GLenum GVar14;
  undefined1 (*varPrefix) [16];
  ostream *poVar15;
  long *plVar16;
  Functions *gl;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  ShaderExecutor *pSVar17;
  _func_int **pp_Var18;
  TestError *this_02;
  int readNdx_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  int numVars;
  long lVar20;
  int readNdx_1;
  size_type __n;
  char *pcVar21;
  int *indices;
  int readNdx;
  GLuint GVar22;
  long lVar23;
  size_type sVar24;
  char *pcVar25;
  int iVar26;
  uint *puVar27;
  uint *puVar28;
  string varName;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inValues;
  Random rnd;
  ShaderSpec shaderSpec;
  ostringstream s;
  ostringstream global;
  ostringstream code;
  undefined1 local_598 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  uint *local_570;
  VarType local_568;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_548;
  deRandom local_530;
  undefined1 local_520 [8];
  undefined1 local_518 [24];
  undefined1 auStack_500 [24];
  _Alloc_hider local_4e8;
  size_type local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  _Alloc_hider local_4c8;
  size_type local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  VarType local_488 [3];
  ios_base local_438 [8];
  ios_base local_430 [264];
  undefined1 local_328 [16];
  pointer local_318;
  ios_base local_2b8 [272];
  undefined1 local_1a8 [16];
  long local_198;
  ios_base local_138 [264];
  undefined4 extraout_var;
  
  uVar2 = this->m_numInstances;
  __n = (size_type)(int)uVar2;
  varPrefix = (undefined1 (*) [16])operator_new(0x10);
  *varPrefix = (undefined1  [16])0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_548,__n,(allocator_type *)local_4a8);
  local_570 = (uint *)operator_new(0x200);
  memset(local_570,0,0x200);
  local_4e8._M_p = (pointer)&local_4d8;
  local_520._0_4_ = GLSL_VERSION_300_ES;
  local_518._0_16_ = (undefined1  [16])0x0;
  stack0xfffffffffffffaf8 = (undefined1  [16])0x0;
  auStack_500._8_16_ = (undefined1  [16])0x0;
  local_4e0 = 0;
  local_4d8._M_local_buf[0] = '\0';
  local_4c8._M_p = (pointer)&local_4b8;
  local_4c0 = 0;
  local_4b8._M_local_buf[0] = '\0';
  uVar10 = (this->m_shaderType >> 0x10 ^ this->m_shaderType ^ 0x3d) * 9;
  uVar5 = (this->m_blockType >> 0x10 ^ this->m_blockType ^ 0x3d) * 9;
  uVar6 = (this->m_indexExprType >> 0x10 ^ this->m_indexExprType ^ 0x3d) * 9;
  uVar10 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d ^
           (uVar5 >> 4 ^ uVar5) * 0x27d4eb2d ^ (uVar10 >> 4 ^ uVar10) * 0x27d4eb2d;
  deRandom_init(&local_530,uVar10 >> 0xf ^ uVar10);
  lVar23 = 0;
  do {
    dVar11 = deRandom_getUint32(&local_530);
    *(uint *)(*varPrefix + lVar23 * 4) = dVar11 % uVar2;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 4);
  if (0 < (int)uVar2) {
    sVar24 = 0;
    do {
      dVar11 = deRandom_getUint32(&local_530);
      local_548.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[sVar24] = dVar11;
      sVar24 = sVar24 + 1;
    } while (__n != sVar24);
  }
  BVar3 = this->m_blockType;
  pcVar21 = "buffer";
  if (BVar3 == BLOCKTYPE_UNIFORM) {
    pcVar21 = "uniform";
  }
  pcVar25 = "std430";
  if (BVar3 == BLOCKTYPE_UNIFORM) {
    pcVar25 = "std140";
  }
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar9 = glu::contextSupports(ctxType,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  IVar12 = this->m_indexExprType;
  if (INDEX_EXPR_TYPE_CONST_EXPRESSION < IVar12 && !bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,"#extension GL_EXT_gpu_shader5 : require\n",0x28);
    IVar12 = this->m_indexExprType;
  }
  if (IVar12 == INDEX_EXPR_TYPE_CONST_EXPRESSION) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_328,"const highp int indexBase = 1;\n",0x1f);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"layout(",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar25,6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,", binding = ",0xc);
  poVar15 = (ostream *)std::ostream::operator<<(local_328,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar15,pcVar21,(ulong)(BVar3 == BLOCKTYPE_UNIFORM) + 6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Block",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n{\n\tuint value;\n} ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"block",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"[",1);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,uVar2);
  pcVar21 = "];\n";
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"];\n",3);
  if (this->m_indexExprType == INDEX_EXPR_TYPE_UNIFORM) {
    declareUniformIndexVars((ostream *)local_328,pcVar21,numVars);
  }
  else if (this->m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
    iVar26 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
      std::ostream::operator<<((Symbol *)local_4a8,iVar26);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
      std::ios_base::~ios_base(local_438);
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_568,0,(char *)0x0,0x1bd417e);
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 == paVar19) {
        local_588._M_allocated_capacity = paVar19->_M_allocated_capacity;
        local_588._8_8_ = plVar16[3];
        local_598._0_8_ = &local_588;
      }
      else {
        local_588._M_allocated_capacity = paVar19->_M_allocated_capacity;
        local_598._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar16;
      }
      local_598._8_8_ = plVar16[1];
      *plVar16 = (long)paVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      if (local_568._0_8_ != (long)&local_568 + 0x10U) {
        operator_delete((void *)local_568._0_8_,local_568.m_data._8_8_ + 1);
      }
      glu::VarType::VarType(&local_568,TYPE_INT,PRECISION_HIGHP);
      deqp::gls::ShaderExecUtil::Symbol::Symbol((Symbol *)local_4a8,(string *)local_598,&local_568);
      std::
      vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
      ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
                ((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                  *)local_518,(Symbol *)local_4a8);
      glu::VarType::~VarType(local_488);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._0_8_ != &local_498) {
        operator_delete((void *)local_4a8._0_8_,local_498._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_568);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._0_8_ != &local_588) {
        operator_delete((void *)local_598._0_8_,local_588._M_allocated_capacity + 1);
      }
      iVar26 = iVar26 + 1;
    } while (iVar26 != 4);
  }
  iVar26 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
    std::ostream::operator<<((Symbol *)local_4a8,iVar26);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
    std::ios_base::~ios_base(local_438);
    indices = (int *)0x6;
    plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_568,0,(char *)0x0,0x1a3ec07);
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 == paVar19) {
      local_588._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_588._8_8_ = plVar16[3];
      local_598._0_8_ = &local_588;
    }
    else {
      local_588._M_allocated_capacity = paVar19->_M_allocated_capacity;
      local_598._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar16;
    }
    local_598._8_8_ = plVar16[1];
    *plVar16 = (long)paVar19;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    if (local_568._0_8_ != (long)&local_568 + 0x10U) {
      operator_delete((void *)local_568._0_8_,local_568.m_data._8_8_ + 1);
    }
    glu::VarType::VarType(&local_568,TYPE_UINT,PRECISION_HIGHP);
    deqp::gls::ShaderExecUtil::Symbol::Symbol((Symbol *)local_4a8,(string *)local_598,&local_568);
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    emplace_back<deqp::gls::ShaderExecUtil::Symbol>
              ((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                *)auStack_500,(Symbol *)local_4a8);
    glu::VarType::~VarType(local_488);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._0_8_ != &local_498) {
      operator_delete((void *)local_4a8._0_8_,local_498._M_allocated_capacity + 1);
    }
    glu::VarType::~VarType(&local_568);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._0_8_ != &local_588) {
      operator_delete((void *)local_598._0_8_,local_588._M_allocated_capacity + 1);
    }
    iVar26 = iVar26 + 1;
  } while (iVar26 != 4);
  lVar23 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"result",6);
    iVar26 = (int)lVar23;
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," = ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"block",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"[",1);
    if (this->m_indexExprType == INDEX_EXPR_TYPE_CONST_EXPRESSION) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"indexBase + ",0xc);
      iVar26 = *(int *)(*varPrefix + lVar23 * 4) + -1;
    }
    else if (this->m_indexExprType == INDEX_EXPR_TYPE_CONST_LITERAL) {
      iVar26 = *(int *)(*varPrefix + lVar23 * 4);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"index",5);
    }
    std::ostream::operator<<((ostream *)local_1a8,iVar26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"].value;\n",9);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 4);
  local_520._0_4_ = bVar9 | GLSL_VERSION_310_ES;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_4e8,(string *)local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._0_8_ != &local_498) {
    operator_delete((void *)local_4a8._0_8_,local_498._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_4c8,(string *)local_4a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._0_8_ != &local_498) {
    operator_delete((void *)local_4a8._0_8_,local_498._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  std::ios_base::~ios_base(local_2b8);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar26 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  gl = (Functions *)CONCAT44(extraout_var,iVar26);
  iVar26 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  sVar24 = __n;
  glu::ObjectVector::ObjectVector
            ((ObjectVector *)local_4a8,(Functions *)CONCAT44(extraout_var_00,iVar26),traits,__n);
  iVar26 = (int)sVar24;
  GVar14 = 0x8a11;
  if (this->m_blockType == BLOCKTYPE_BUFFER) {
    GVar14 = 0x90d2;
  }
  pSVar17 = deqp::gls::ShaderExecUtil::createExecutor
                      (renderCtx,this->m_shaderType,(ShaderSpec *)local_520);
  local_328 = (undefined1  [16])0x0;
  local_318 = (pointer)0x0;
  local_198 = 0;
  local_1a8 = (undefined1  [16])0x0;
  local_588._M_allocated_capacity = 0;
  local_598 = (undefined1  [16])0x0;
  (*pSVar17->_vptr_ShaderExecutor[3])
            (pSVar17,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  iVar13 = (*pSVar17->_vptr_ShaderExecutor[2])(pSVar17);
  if ((char)iVar13 == '\0') {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fOpaqueTypeIndexingTests.cpp"
               ,0x36a);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar17->_vptr_ShaderExecutor[5])(pSVar17);
  if (0 < (int)uVar2) {
    GVar22 = 2;
    lVar23 = 0;
    do {
      (*gl->bindBuffer)(GVar14,*(GLuint *)(local_498._M_allocated_capacity + lVar23));
      iVar26 = 0x88e4;
      (*gl->bufferData)(GVar14,4,(void *)((long)local_548.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar23),
                        0x88e4);
      (*gl->bindBufferBase)(GVar14,GVar22,*(GLuint *)(local_498._M_allocated_capacity + lVar23));
      GVar22 = GVar22 + 1;
      lVar23 = lVar23 + 4;
    } while (__n << 2 != lVar23);
  }
  if (this->m_indexExprType == INDEX_EXPR_TYPE_UNIFORM) {
    dVar11 = (*pSVar17->_vptr_ShaderExecutor[4])(pSVar17);
    uploadUniformIndices(gl,dVar11,(char *)varPrefix,iVar26,indices);
  }
  else if (this->m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_328,0x80);
    lVar23 = 0;
    pp_Var18 = (_func_int **)local_328._0_8_;
    do {
      uVar4 = *(undefined4 *)(*varPrefix + lVar23 * 4);
      lVar20 = 0;
      do {
        puVar1 = (undefined4 *)((long)pp_Var18 + lVar20 * 4);
        *puVar1 = uVar4;
        puVar1[1] = uVar4;
        puVar1[2] = uVar4;
        puVar1[3] = uVar4;
        lVar20 = lVar20 + 4;
      } while (lVar20 != 0x20);
      lVar23 = lVar23 + 1;
      pp_Var18 = pp_Var18 + 0x10;
    } while (lVar23 != 4);
    lVar23 = 0;
    do {
      local_568._0_8_ = local_328._0_8_ + lVar23;
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)local_1a8,(void **)&local_568);
      lVar23 = lVar23 + 0x80;
    } while (lVar23 != 0x200);
  }
  lVar23 = 0;
  do {
    local_568._0_8_ = (long)local_570 + lVar23;
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)local_598,(void **)&local_568);
    lVar23 = lVar23 + 0x80;
  } while (lVar23 != 0x200);
  GVar14 = (*gl->getError)();
  glu::checkError(GVar14,"Setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fOpaqueTypeIndexingTests.cpp"
                  ,0x388);
  pp_Var18 = (_func_int **)0x0;
  if (local_1a8._0_8_ != local_1a8._8_8_) {
    pp_Var18 = (_func_int **)local_1a8._0_8_;
  }
  (*pSVar17->_vptr_ShaderExecutor[6])(pSVar17,0x20,pp_Var18,local_598._0_8_);
  if ((pointer)local_598._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_598._0_8_,local_588._M_allocated_capacity - local_598._0_8_);
  }
  if ((_func_int **)local_1a8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_1a8._0_8_,local_198 - local_1a8._0_8_);
  }
  if ((_func_int **)local_328._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_328._0_8_,(long)local_318 - local_328._0_8_);
  }
  (*pSVar17->_vptr_ShaderExecutor[1])(pSVar17);
  glu::ObjectVector::~ObjectVector((ObjectVector *)local_4a8);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  this_00 = (ostringstream *)(local_4a8 + 8);
  lVar23 = 0;
  puVar27 = local_570;
  do {
    lVar20 = 0;
    puVar28 = puVar27;
    do {
      auVar8 = local_328;
      uVar2 = local_548.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[*(int *)(*varPrefix + lVar20 * 4)];
      local_328._4_4_ = 0;
      local_328._0_4_ = *puVar28;
      uVar7 = local_328._0_8_;
      local_328 = auVar8;
      if (uVar2 != *puVar28) {
        local_4a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"ERROR: at invocation ",0x15);
        std::ostream::operator<<(this_00,(int)lVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", read ",7);
        std::ostream::operator<<(this_00,(int)lVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,": expected ",0xb);
        local_328._0_8_ = (_func_int **)(ulong)uVar2;
        tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_328,(ostream *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", got ",6);
        local_328 = CONCAT88(local_328._8_8_,uVar7);
        tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_328,(ostream *)this_00);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_430);
        this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Invalid result value");
        }
      }
      lVar20 = lVar20 + 1;
      puVar28 = puVar28 + 0x20;
    } while (lVar20 != 4);
    lVar23 = lVar23 + 1;
    puVar27 = puVar27 + 1;
  } while (lVar23 != 0x20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_p != &local_4b8) {
    operator_delete(local_4c8._M_p,
                    CONCAT71(local_4b8._M_allocated_capacity._1_7_,local_4b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_p != &local_4d8) {
    operator_delete(local_4e8._M_p,
                    CONCAT71(local_4d8._M_allocated_capacity._1_7_,local_4d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)auStack_500);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)local_518);
  operator_delete(local_570,0x200);
  if (local_548.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_548.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_548.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_548.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(varPrefix,0x10);
  return STOP;
}

Assistant:

BlockArrayIndexingCase::IterateResult BlockArrayIndexingCase::iterate (void)
{
	const int			numInvocations		= 32;
	const int			numInstances		= m_numInstances;
	const int			numReads			= 4;
	vector<int>			readIndices			(numReads);
	vector<deUint32>	inValues			(numInstances);
	vector<deUint32>	outValues			(numInvocations*numReads);
	ShaderSpec			shaderSpec;
	de::Random			rnd					(deInt32Hash(m_shaderType) ^ deInt32Hash(m_blockType) ^ deInt32Hash(m_indexExprType));

	for (int readNdx = 0; readNdx < numReads; readNdx++)
		readIndices[readNdx] = rnd.getInt(0, numInstances-1);

	for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		inValues[instanceNdx] = rnd.getUint32();

	getShaderSpec(&shaderSpec, numInstances, numReads, &readIndices[0], m_context.getRenderContext());

	{
		const RenderContext&	renderCtx		= m_context.getRenderContext();
		const glw::Functions&	gl				= renderCtx.getFunctions();
		const int				baseBinding		= 2;
		const BufferVector		buffers			(renderCtx, numInstances);
		const deUint32			bufTarget		= m_blockType == BLOCKTYPE_BUFFER ? GL_SHADER_STORAGE_BUFFER : GL_UNIFORM_BUFFER;
		ShaderExecutorPtr		shaderExecutor	(createExecutor(renderCtx, m_shaderType, shaderSpec));
		vector<int>				expandedIndices;
		vector<void*>			inputs;
		vector<void*>			outputs;

		m_testCtx.getLog() << *shaderExecutor;

		if (!shaderExecutor->isOk())
			TCU_FAIL("Compile failed");

		shaderExecutor->useProgram();

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			gl.bindBuffer(bufTarget, buffers[instanceNdx]);
			gl.bufferData(bufTarget, (glw::GLsizeiptr)sizeof(deUint32), &inValues[instanceNdx], GL_STATIC_DRAW);
			gl.bindBufferBase(bufTarget, baseBinding+instanceNdx, buffers[instanceNdx]);
		}

		if (m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM)
		{
			expandedIndices.resize(numInvocations * readIndices.size());

			for (int readNdx = 0; readNdx < numReads; readNdx++)
			{
				int* dst = &expandedIndices[numInvocations*readNdx];
				std::fill(dst, dst+numInvocations, readIndices[readNdx]);
			}

			for (int readNdx = 0; readNdx < numReads; readNdx++)
				inputs.push_back(&expandedIndices[readNdx*numInvocations]);
		}
		else if (m_indexExprType == INDEX_EXPR_TYPE_UNIFORM)
			uploadUniformIndices(gl, shaderExecutor->getProgram(), "index", numReads, &readIndices[0]);

		for (int readNdx = 0; readNdx < numReads; readNdx++)
			outputs.push_back(&outValues[readNdx*numInvocations]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		shaderExecutor->execute(numInvocations, inputs.empty() ? DE_NULL : &inputs[0], &outputs[0]);
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int invocationNdx = 0; invocationNdx < numInvocations; invocationNdx++)
	{
		for (int readNdx = 0; readNdx < numReads; readNdx++)
		{
			const deUint32	refValue	= inValues[readIndices[readNdx]];
			const deUint32	resValue	= outValues[readNdx*numInvocations + invocationNdx];

			if (refValue != resValue)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at invocation " << invocationNdx
													   << ", read " << readNdx << ": expected "
													   << tcu::toHex(refValue) << ", got " << tcu::toHex(resValue)
								   << TestLog::EndMessage;

				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid result value");
			}
		}
	}

	return STOP;
}